

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_2443ed::TfFinder::handleToken(TfFinder *this,Token *token)

{
  token_type_e tVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  long lStack_80;
  allocator<char> local_69;
  string value;
  string local_48;
  
  tVar1 = token->type;
  std::__cxx11::string::string((string *)&value,(string *)&token->value);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->DA,&token->raw_value);
  switch(tVar1) {
  case tt_integer:
  case tt_real:
    dVar4 = strtod(value._M_dataplus._M_p,(char **)0x0);
    this->last_num = dVar4;
    local_48._M_dataplus._M_p =
         (pointer)(((long)(this->DA).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->DA).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) + -1);
    iVar3 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert
                      ((unsigned_long *)&local_48);
    this->last_num_idx = iVar3;
    goto switchD_0015b671_caseD_a;
  case tt_name:
    lStack_80 = 0x50;
    break;
  default:
    goto switchD_0015b671_caseD_a;
  case tt_word:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Tf",&local_69);
    bVar2 = QPDFTokenizer::Token::isWord(token,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if (!bVar2) goto switchD_0015b671_caseD_a;
    dVar4 = this->last_num;
    if ((1.0 < dVar4) && (dVar4 < 1000.0)) {
      this->tf = dVar4;
    }
    this->tf_idx = this->last_num_idx;
    lStack_80 = 0x20;
  }
  std::__cxx11::string::_M_assign
            ((string *)((long)&(this->super_TokenFilter)._vptr_TokenFilter + lStack_80));
switchD_0015b671_caseD_a:
  std::__cxx11::string::~string((string *)&value);
  return;
}

Assistant:

void
TfFinder::handleToken(QPDFTokenizer::Token const& token)
{
    QPDFTokenizer::token_type_e ttype = token.getType();
    std::string value = token.getValue();
    DA.push_back(token.getRawValue());
    switch (ttype) {
    case QPDFTokenizer::tt_integer:
    case QPDFTokenizer::tt_real:
        last_num = strtod(value.c_str(), nullptr);
        last_num_idx = QIntC::to_int(DA.size() - 1);
        break;

    case QPDFTokenizer::tt_name:
        last_name = value;
        break;

    case QPDFTokenizer::tt_word:
        if (token.isWord("Tf")) {
            if ((last_num > 1.0) && (last_num < 1000.0)) {
                // These ranges are arbitrary but keep us from doing insane things or suffering from
                // over/underflow
                tf = last_num;
            }
            tf_idx = last_num_idx;
            font_name = last_name;
        }
        break;

    default:
        break;
    }
}